

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_seek.c
# Opt level: O1

int64_t mpt_stream_seek(mpt_stream *stream,int64_t pos,int mode)

{
  uint uVar1;
  int __fd;
  __off_t _Var2;
  size_t sVar3;
  mpt_decode_queue *pmVar4;
  
  uVar1 = mpt_stream_flags(&stream->_info);
  if ((uVar1 & 3) == 1) {
    if ((stream->_wd)._enc != (mpt_data_encoder_t)0x0) {
      return -1;
    }
    if ((stream->_wd)._state.scratch != 0) {
      return -4;
    }
    mpt_stream_flush(stream);
    if ((uVar1 & 0x20) != 0 && mode == 1) {
      pos = pos + (stream->_wd).data.len;
    }
    pmVar4 = (mpt_decode_queue *)&stream->_wd;
    __fd = _mpt_stream_fread(&stream->_info);
    (stream->_wd)._state._ctx = 0;
    (stream->_wd)._state.done = 0;
    (stream->_wd)._state.scratch = 0;
    sVar3 = 0;
  }
  else {
    if ((uVar1 & 3) != 0) {
      return -1;
    }
    if ((stream->_rd)._dec != (mpt_data_decoder_t)0x0) {
      return -1;
    }
    if ((uVar1 & 0x10) == 0 || mode != 1) {
      sVar3 = 0;
    }
    else {
      pos = pos - (stream->_rd).data.len;
      sVar3 = (stream->_rd).data.off;
    }
    pmVar4 = &stream->_rd;
    __fd = _mpt_stream_fread(&stream->_info);
    (stream->_rd)._state._ctx = 0;
    (stream->_rd)._state.curr = 0;
    (stream->_rd)._state.data.pos = 0;
    (stream->_rd)._state.data.len = 0;
    (stream->_rd)._state.data.msg = -1;
  }
  if (-1 < __fd) {
    _Var2 = lseek(__fd,pos,mode);
    if (_Var2 < 0) {
      sVar3 = 0xfffffffffffffffc;
    }
    else {
      (pmVar4->data).len = 0;
      (pmVar4->data).off = 0;
      sVar3 = sVar3 + _Var2;
    }
  }
  return sVar3;
}

Assistant:

extern int64_t mpt_stream_seek(MPT_STRUCT(stream) *stream, int64_t pos, int mode)
{
	static const MPT_STRUCT(decode_state) def_dec = MPT_DECODE_INIT;
	static const MPT_STRUCT(encode_state) def_enc = MPT_ENCODE_INIT;
	MPT_STRUCT(queue) *qu;
	off_t add;
	int flags, file = -1;
	
	flags = mpt_stream_flags(&stream->_info);
	
	if ((add = pos) < 0 && pos > 0) {
		return MPT_ERROR(BadValue);
	}
	add = 0;
	switch (flags & (MPT_STREAMFLAG(Write) | MPT_STREAMFLAG(RdWr))) {
	    case MPT_STREAMFLAG(Read):
		if (stream->_rd._dec) {
			return MPT_ERROR(BadArgument);
		}
		qu = &stream->_rd.data;
		if (mode == SEEK_CUR && (flags & MPT_STREAMFLAG(ReadBuf))) {
			pos -= qu->len;
			add = qu->off;
		}
		file = _mpt_stream_fread(&stream->_info);
		stream->_rd._state = def_dec;
		break;
	    case MPT_STREAMFLAG(Write):
		if (stream->_wd._enc) {
			return MPT_ERROR(BadArgument);
		}
		if (stream->_wd._state.scratch) {
			return MPT_ERROR(BadOperation);
		}
		mpt_stream_flush(stream);
		qu = &stream->_wd.data;
		if (mode == SEEK_CUR && (flags & MPT_STREAMFLAG(WriteBuf))) {
			pos += qu->len;
		}
		file = _mpt_stream_fread(&stream->_info);
		stream->_wd._state = def_enc;
		break;
	    default:
		return MPT_ERROR(BadArgument);
	}
	if (file < 0) {
		return add;
	}
	if ((pos = lseek(file, pos, mode)) < 0) {
		return MPT_ERROR(BadOperation);
	}
	qu->len = 0;
	qu->off = 0;
	
	return pos + add;
}